

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::SourceCodeInfo_Location::InternalSerializeWithCachedSizesToArray
          (SourceCodeInfo_Location *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  int iVar2;
  int size;
  uint8 *puVar3;
  char *pcVar4;
  string *psVar5;
  UnknownFieldSet *unknown_fields;
  int local_48;
  int n;
  int i;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  SourceCodeInfo_Location *this_local;
  
  iVar2 = path_size(this);
  _i = target;
  if (0 < iVar2) {
    puVar3 = internal::WireFormatLite::WriteTagToArray(1,WIRETYPE_LENGTH_DELIMITED,target);
    puVar3 = io::CodedOutputStream::WriteVarint32ToArray(this->_path_cached_byte_size_,puVar3);
    _i = internal::WireFormatLite::WriteInt32NoTagToArray(&this->path_,puVar3);
  }
  iVar2 = span_size(this);
  if (0 < iVar2) {
    puVar3 = internal::WireFormatLite::WriteTagToArray(2,WIRETYPE_LENGTH_DELIMITED,_i);
    puVar3 = io::CodedOutputStream::WriteVarint32ToArray(this->_span_cached_byte_size_,puVar3);
    _i = internal::WireFormatLite::WriteInt32NoTagToArray(&this->span_,puVar3);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    leading_comments_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    leading_comments_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.SourceCodeInfo.Location.leading_comments");
    psVar5 = leading_comments_abi_cxx11_(this);
    _i = internal::WireFormatLite::WriteStringToArray(3,psVar5,_i);
  }
  if ((uVar1 & 2) != 0) {
    trailing_comments_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    trailing_comments_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.SourceCodeInfo.Location.trailing_comments");
    psVar5 = trailing_comments_abi_cxx11_(this);
    _i = internal::WireFormatLite::WriteStringToArray(4,psVar5,_i);
  }
  local_48 = 0;
  iVar2 = leading_detached_comments_size(this);
  for (; local_48 < iVar2; local_48 = local_48 + 1) {
    leading_detached_comments_abi_cxx11_(this,local_48);
    pcVar4 = (char *)std::__cxx11::string::data();
    leading_detached_comments_abi_cxx11_(this,local_48);
    size = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,size,SERIALIZE,
               "google.protobuf.SourceCodeInfo.Location.leading_detached_comments");
    psVar5 = leading_detached_comments_abi_cxx11_(this,local_48);
    _i = internal::WireFormatLite::WriteStringToArray(6,psVar5,_i);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = SourceCodeInfo_Location::unknown_fields(this);
    _i = internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,_i);
  }
  return _i;
}

Assistant:

::google::protobuf::uint8* SourceCodeInfo_Location::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.SourceCodeInfo.Location)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  if (this->path_size() > 0) {
    target = ::google::protobuf::internal::WireFormatLite::WriteTagToArray(
      1,
      ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
      target);
    target = ::google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(
      _path_cached_byte_size_, target);
    target = ::google::protobuf::internal::WireFormatLite::
      WriteInt32NoTagToArray(this->path_, target);
  }

  // repeated int32 span = 2 [packed = true];
  if (this->span_size() > 0) {
    target = ::google::protobuf::internal::WireFormatLite::WriteTagToArray(
      2,
      ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
      target);
    target = ::google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(
      _span_cached_byte_size_, target);
    target = ::google::protobuf::internal::WireFormatLite::
      WriteInt32NoTagToArray(this->span_, target);
  }

  cached_has_bits = _has_bits_[0];
  // optional string leading_comments = 3;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->leading_comments().data(), this->leading_comments().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.SourceCodeInfo.Location.leading_comments");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        3, this->leading_comments(), target);
  }

  // optional string trailing_comments = 4;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->trailing_comments().data(), this->trailing_comments().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.SourceCodeInfo.Location.trailing_comments");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        4, this->trailing_comments(), target);
  }

  // repeated string leading_detached_comments = 6;
  for (int i = 0, n = this->leading_detached_comments_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->leading_detached_comments(i).data(), this->leading_detached_comments(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.SourceCodeInfo.Location.leading_detached_comments");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(6, this->leading_detached_comments(i), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.SourceCodeInfo.Location)
  return target;
}